

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<float,_gimage::PixelTraits<float>_> *
gimage::cropImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,long x,long y,long w,long h)

{
  int iVar1;
  float ***pppfVar2;
  float ***pppfVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  
  lVar8 = 0;
  if (0 < w) {
    lVar8 = w;
  }
  lVar11 = 0;
  if (0 < h) {
    lVar11 = h;
  }
  iVar1 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (float *)0x0;
  __return_storage_ptr__->row = (float **)0x0;
  __return_storage_ptr__->img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (__return_storage_ptr__,lVar8,lVar11,(long)iVar1);
  if ((((y | x) < 0) || (image->width < lVar8 + x)) || (image->height < lVar11 + y)) {
    uVar4 = (ulong)image->depth;
    bVar12 = 0 < (long)uVar4;
    if (0 < (long)uVar4) {
      uVar5 = 0;
      do {
        if (0 < h) {
          pppfVar2 = __return_storage_ptr__->img;
          lVar8 = 0;
          do {
            if (0 < w) {
              lVar11 = lVar8 + y;
              lVar7 = image->width;
              pppfVar3 = image->img;
              pfVar9 = pppfVar2[uVar5][lVar8];
              lVar6 = w;
              lVar10 = x;
              do {
                fVar13 = INFINITY;
                if (((!(bool)(lVar10 < 0 | ~bVar12 & 1U)) && (fVar13 = INFINITY, -1 < lVar11)) &&
                   ((fVar13 = INFINITY, lVar10 < lVar7 &&
                    (fVar13 = INFINITY, lVar11 < image->height)))) {
                  fVar13 = pppfVar3[uVar5][lVar11][lVar10];
                }
                *pfVar9 = fVar13;
                lVar10 = lVar10 + 1;
                pfVar9 = pfVar9 + 1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != h);
        }
        uVar5 = uVar5 + 1;
        bVar12 = uVar5 < uVar4;
      } while (uVar5 != uVar4);
    }
  }
  else if (0 < image->depth) {
    lVar11 = 0;
    do {
      if (0 < h) {
        lVar7 = 0;
        do {
          memcpy(__return_storage_ptr__->img[lVar11][lVar7],image->img[lVar11][y + lVar7] + x,
                 lVar8 << 2);
          lVar7 = lVar7 + 1;
        } while (h != lVar7);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < image->depth);
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> cropImage(const Image<T> &image, long x, long y, long w, long h)
{
  w=std::max(0l, w);
  h=std::max(0l, h);

  Image<T> ret(w, h, image.getDepth());

  if (x >= 0 && y >= 0 && x+w <= image.getWidth() && y+h <= image.getHeight())
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        memcpy(ret.getPtr(0, k, d), image.getPtr(x, y+k, d), w*sizeof(T));
      }
    }
  }
  else
  {
    for (int d=0; d<image.getDepth(); d++)
    {
      for (long k=0; k<h; k++)
      {
        for (long i=0; i<w; i++)
          ret.set(i, k, d,
                  static_cast<typename Image<T>::store_t>(image.getBoundsInv(x+i, y+k, d)));
      }
    }
  }

  return ret;
}